

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O1

void __thiscall gmath::PinholeCamera::PinholeCamera(PinholeCamera *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  double (*padVar2) [3];
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR__Camera_001637d0;
  (this->super_Camera).name._M_dataplus._M_p = (pointer)&(this->super_Camera).name.field_2;
  (this->super_Camera).name._M_string_length = 0;
  (this->super_Camera).name.field_2._M_local_buf[0] = '\0';
  (this->super_Camera).R.v[0][0] = 0.0;
  (this->super_Camera).R.v[0][1] = 0.0;
  (this->super_Camera).R.v[0][2] = 0.0;
  (this->super_Camera).R.v[1][0] = 0.0;
  (this->super_Camera).R.v[1][1] = 0.0;
  (this->super_Camera).R.v[1][2] = 0.0;
  (this->super_Camera).R.v[2][0] = 0.0;
  (this->super_Camera).R.v[2][1] = 0.0;
  (this->super_Camera).R.v[2][2] = 0.0;
  auVar3 = _DAT_001534a0;
  lVar4 = 0x58;
  auVar7 = _DAT_00153490;
  do {
    auVar6 = auVar7 ^ auVar3;
    if (auVar6._4_4_ == -0x80000000 && auVar6._0_4_ < -0x7ffffffd) {
      *(undefined8 *)((long)((this->super_Camera).R.v + -4) + 8 + lVar4) = 0x3ff0000000000000;
      *(undefined8 *)((long)((this->super_Camera).R.v + -3) + 0x10 + lVar4) = 0x3ff0000000000000;
    }
    lVar5 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 2;
    auVar7._8_8_ = lVar5 + 2;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0xd8);
  pvVar1 = &(this->super_Camera).match;
  (pvVar1->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar4 = 0;
  (this->super_Camera).match.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Camera).width = 0;
  (this->super_Camera).height = 0;
  (this->super_Camera).T.v[0] = 0.0;
  (this->super_Camera).T.v[1] = 0.0;
  *(undefined1 (*) [16])((this->super_Camera).T.v + 2) = (undefined1  [16])0x0;
  (this->super_Camera).zmax = 1.79769313486232e+308;
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR__PinholeCamera_00163830;
  *(double *)((long)((this->A).v + 0) + 0) = 0.0;
  *(double *)((long)((this->A).v + 0) + 8) = 0.0;
  *(undefined1 (*) [16])((this->A).v[0] + 2) = (undefined1  [16])0x0;
  padVar2 = (this->A).v;
  *(double *)((long)(padVar2 + 1) + 8) = 0.0;
  *(double *)((long)(padVar2 + 1) + 0x10) = 0.0;
  *(double *)((long)((this->A).v + 2) + 0) = 0.0;
  *(double *)((long)((this->A).v + 2) + 8) = 0.0;
  (this->A).v[2][2] = 0.0;
  auVar6 = _DAT_00153490;
  do {
    auVar7 = auVar6 ^ auVar3;
    if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7ffffffd) {
      *(undefined8 *)((long)(this->A).v[0] + lVar4) = 0x3ff0000000000000;
      *(undefined8 *)((long)(this->A).v[1] + lVar4 + 8) = 0x3ff0000000000000;
    }
    lVar5 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 2;
    auVar6._8_8_ = lVar5 + 2;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x80);
  this->rho = 0.0;
  this->dist = (Distortion *)0x0;
  return;
}

Assistant:

virtual ~Camera() {}